

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

uint32_t helper_uc_hooksys64(CPUARMState *env,uint32_t insn,void *hk)

{
  uint32_t uVar1;
  hook *hook;
  uint uVar2;
  int iVar3;
  uc_arm64_cp_reg cp_reg;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  uint local_10;
  uint64_t local_8;
  
  uVar1 = 0;
  if (*(char *)((long)hk + 0x14) == '\0') {
    uVar2 = insn & 0x1f;
    local_18 = insn >> 0x13 & 3;
    local_14 = insn >> 0x10 & 7;
    local_20 = insn >> 0xc & 0xf;
    local_1c = insn >> 8 & 0xf;
    local_10 = insn >> 5 & 7;
    if (uVar2 < 0x1d) {
      iVar3 = uVar2 + 199;
      local_8 = env->xregs[uVar2];
    }
    else if (uVar2 == 0x1e) {
      local_8 = env->xregs[0x1e];
      iVar3 = 2;
    }
    else if (uVar2 == 0x1d) {
      local_8 = env->xregs[0x1d];
      iVar3 = 1;
    }
    else {
      iVar3 = 7;
      local_8 = 0;
    }
    uVar1 = (**(code **)((long)hk + 0x28))(env->uc,iVar3,&local_20,*(undefined8 *)((long)hk + 0x30))
    ;
  }
  return uVar1;
}

Assistant:

uint32_t HELPER(uc_hooksys64)(CPUARMState *env, uint32_t insn, void *hk)
{
    uc_arm64_reg uc_rt;
    struct hook *hook = (struct hook*)hk;
    uc_arm64_cp_reg cp_reg;
    uint32_t rt;

    if (hook->to_delete) {
        return 0;
    }

    rt = extract32(insn, 0, 5);
    cp_reg.op0 = extract32(insn, 19, 2);
    cp_reg.op1 = extract32(insn, 16, 3);
    cp_reg.crn = extract32(insn, 12, 4);
    cp_reg.crm = extract32(insn, 8, 4);
    cp_reg.op2 = extract32(insn, 5, 3);

    if (rt <= 28 && rt >= 0) {
        uc_rt = UC_ARM64_REG_X0 + rt;
        cp_reg.val = env->xregs[rt];
    } else if (rt == 29 ) {
        uc_rt = UC_ARM64_REG_X29;
        cp_reg.val = env->xregs[29];
    } else if (rt == 30) {
        uc_rt = UC_ARM64_REG_X30;
        cp_reg.val = env->xregs[30];
    } else {
        uc_rt = UC_ARM64_REG_XZR;
        cp_reg.val = 0;
    }

    return ((uc_cb_insn_sys_t)(hook->callback))(env->uc, uc_rt, &cp_reg, hook->user_data);
}